

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_core_generic_syslog.c
# Opt level: O2

void os_core_generic_syslog(oonf_log_severity severity,char *msg)

{
  uint __pri;
  
  __pri = 7;
  if (severity != LOG_SEVERITY_DEBUG) {
    __pri = severity == LOG_SEVERITY_INFO | 4;
  }
  syslog(__pri,"%s",msg);
  return;
}

Assistant:

void
os_core_generic_syslog(enum oonf_log_severity severity, const char *msg) {
  int log_sev;

  switch (severity) {
    case LOG_SEVERITY_DEBUG:
      log_sev = LOG_DEBUG;
      break;
    case LOG_SEVERITY_INFO:
      log_sev = LOG_NOTICE;
      break;
    default:
    case LOG_SEVERITY_WARN:
      log_sev = LOG_WARNING;
      break;
  }

  syslog(log_sev, "%s", msg);
}